

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_orderedby(lysp_yang_ctx *ctx,lysp_node *llist)

{
  ulong uVar1;
  ushort uVar2;
  LY_ERR LVar3;
  int iVar4;
  char *pcVar5;
  ly_ctx *plVar6;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  ly_stmt local_4c;
  char *local_48;
  ulong local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  if ((llist->flags & 0xc0) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","ordered-by");
    return LY_EVALID;
  }
  LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_48,&local_38,&local_40);
  uVar1 = local_40;
  if (LVar3 != LY_SUCCESS) goto LAB_00174838;
  if (local_40 == 4) {
    iVar4 = strncmp(local_48,"user",4);
    if (iVar4 != 0) goto LAB_001747eb;
    uVar2 = 0x40;
LAB_00174857:
    llist->flags = llist->flags | uVar2;
    LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
    if ((LVar3 != LY_SUCCESS) || (LVar3 = LY_SUCCESS, local_4c == LY_STMT_SYNTAX_SEMICOLON))
    goto LAB_00174838;
    if (local_4c == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
      if ((LVar3 == LY_SUCCESS) && (LVar3 = LY_SUCCESS, local_4c != LY_STMT_SYNTAX_RIGHT_BRACE)) {
        do {
          if (local_4c != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar5 = lyplg_ext_stmt2str(local_4c);
            ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,"ordered-by");
            goto LAB_00174833;
          }
          LVar3 = parse_ext(ctx,local_48,local_40,llist,LY_STMT_ORDERED_BY,0,&llist->exts);
        } while (((LVar3 == LY_SUCCESS) &&
                 (LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40), LVar3 == LY_SUCCESS)) &&
                (LVar3 = LY_SUCCESS, local_4c != LY_STMT_SYNTAX_RIGHT_BRACE));
      }
      goto LAB_00174838;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar5 = lyplg_ext_stmt2str(local_4c);
    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\".",
            pcVar5);
  }
  else {
    if ((local_40 == 6) && (iVar4 = strncmp(local_48,"system",6), iVar4 == 0)) {
      uVar2 = 0x80;
      goto LAB_00174857;
    }
LAB_001747eb:
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
            uVar1 & 0xffffffff,local_48,"ordered-by");
  }
LAB_00174833:
  LVar3 = LY_EVALID;
LAB_00174838:
  free(local_38);
  return LVar3;
}

Assistant:

static LY_ERR
parse_orderedby(struct lysp_yang_ctx *ctx, struct lysp_node *llist)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (llist->flags & LYS_ORDBY_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "ordered-by");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if ((word_len == ly_strlen_const("system")) && !strncmp(word, "system", word_len)) {
        llist->flags |= LYS_ORDBY_SYSTEM;
    } else if ((word_len == ly_strlen_const("user")) && !strncmp(word, "user", word_len)) {
        llist->flags |= LYS_ORDBY_USER;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "ordered-by");
        ret = LY_EVALID;
        goto cleanup;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, llist, LY_STMT_ORDERED_BY, 0, &llist->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "ordered-by");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}